

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::CY<std::complex<float>_>::equals
          (CY<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  int iVar1;
  int iVar2;
  bool local_51;
  QControlledGate2<std::complex<float>_> *local_40;
  CG *p;
  QObject<std::complex<float>_> *other_local;
  CY<std::complex<float>_> *this_local;
  
  if (other == (QObject<std::complex<float>_> *)0x0) {
    local_40 = (QControlledGate2<std::complex<float>_> *)0x0;
  }
  else {
    local_40 = (QControlledGate2<std::complex<float>_> *)
               __dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                              &CY<std::complex<float>>::typeinfo,0);
  }
  if (local_40 != (QControlledGate2<std::complex<float>_> *)0x0) {
    iVar1 = QControlledGate2<std::complex<float>_>::controlState(local_40);
    iVar2 = QControlledGate2<std::complex<float>_>::controlState
                      (&this->super_QControlledGate2<std::complex<float>_>);
    if (iVar1 != iVar2) {
      return false;
    }
    iVar1 = QControlledGate2<std::complex<float>_>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      iVar1 = QControlledGate2<std::complex<float>_>::control
                        (&this->super_QControlledGate2<std::complex<float>_>);
      iVar2 = (*(this->super_QControlledGate2<std::complex<float>_>).
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
                [0xf])();
      if (iVar1 < iVar2) {
        return true;
      }
    }
    iVar1 = QControlledGate2<std::complex<float>_>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    local_51 = false;
    if (iVar2 < iVar1) {
      iVar1 = QControlledGate2<std::complex<float>_>::control
                        (&this->super_QControlledGate2<std::complex<float>_>);
      iVar2 = (*(this->super_QControlledGate2<std::complex<float>_>).
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
                [0xf])();
      local_51 = iVar2 < iVar1;
    }
    return local_51;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CY< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }